

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOBoard.cpp
# Opt level: O1

optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
IOBoard::readBoardFromFile
          (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,IOBoard *this,string *fileName)

{
  int iVar1;
  char *__nptr;
  bool bVar2;
  istream *piVar3;
  int *piVar4;
  ulong uVar5;
  istream *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  string value_as_string;
  stringstream sstr;
  ifstream ifs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_408;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined8 local_3d8;
  char local_3d0;
  undefined7 uStack_3cf;
  stringstream local_3c0 [16];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [2];
  streambuf local_228 [16];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)fileName,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::__cxx11::stringstream::stringstream(local_3c0);
    local_3f0 = __return_storage_ptr__;
    std::ostream::operator<<(local_3b0,local_228);
    std::ifstream::close();
    local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e0 = &local_3d0;
    local_3d8 = 0;
    local_3d0 = '\0';
    while (this_00 = (istream *)local_3c0,
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_3c0,(string *)&local_3e0,','), __nptr = local_3e0,
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      *piVar4 = 0;
      uVar5 = strtol(__nptr,&local_3e8,10);
      if (local_3e8 == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_00116a24:
        std::__throw_out_of_range("stoi");
      }
      if (((long)(int)uVar5 != uVar5) || (*piVar4 == 0x22)) goto LAB_00116a24;
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
      local_3e8 = (char *)(uVar5 & 0xffffffff);
      if (local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_408,
                   (iterator)
                   local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_3e8);
      }
      else {
        *local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)local_3e8;
        local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    bVar2 = validate((IOBoard *)this_00,&local_408);
    __return_storage_ptr__ = local_3f0;
    if (bVar2) {
      *(pointer *)
       &(local_3f0->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(local_3f0->
               super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
           local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(local_3f0->
               super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10) =
           local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    (local_3f0->
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_engaged = bVar2;
    if (local_3e0 != &local_3d0) {
      operator_delete(local_3e0,CONCAT71(uStack_3cf,local_3d0) + 1);
    }
    if (local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_408.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_408.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_408.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::stringstream::~stringstream(local_3c0);
    std::ios_base::~ios_base(local_340);
  }
  else {
    Message::putMessage(OK);
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_engaged = false;
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<size_t>> IOBoard::readBoardFromFile( const std::string& fileName )
{
    std::ifstream ifs( fileName );
    if ( !ifs )
    {
        Message::putMessage( Result::READ_BOARD_ERROR );
        return std::nullopt;
    }

    std::stringstream sstr;
    sstr << ifs.rdbuf();
    ifs.close();

    std::vector<size_t> values;
    std::string value_as_string;
    uint boardValue;
    while( std::getline( sstr, value_as_string, ',' ))
    {
        try
        {
            boardValue = std::stoi( value_as_string );
        }
        catch (...)
        {
            Message::putMessage( Result::FILE_ERROR_VALUE_NOT_NUMBER );
            return std::nullopt;
        }
        values.push_back( boardValue );
    }

    if ( validate( values ) == false )
    {
        return std::nullopt;
    }
    return values;
}